

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>>::
initialize<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>>
          (optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>> *this,
          Animatable<tinyusdz::UsdUVTexture::SourceColorSpace> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>>)0x1) {
    tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>::Animatable
              ((Animatable<tinyusdz::UsdUVTexture::SourceColorSpace> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>, V = tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }